

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall CheaterBotStrategy::cheaterAttack(CheaterBotStrategy *this)

{
  Country *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar5;
  reference ppCVar6;
  GameLoop *this_01;
  vector<Player_*,_std::allocator<Player_*>_> *this_02;
  reference ppPVar7;
  PlayerStrategy *pPVar8;
  string local_a0;
  Player *local_80;
  Player *i;
  iterator __end3;
  iterator __begin3;
  vector<Player_*,_std::allocator<Player_*>_> *__range3;
  Player *defendingPlayer;
  Country *neighbour;
  iterator __end2;
  iterator __begin2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2;
  Country *country;
  iterator __end1;
  iterator __begin1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range1;
  CheaterBotStrategy *this_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "We have a cheater! They are conquering all their neighbouring countries"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pvVar5 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
  __end1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar5);
  country = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar5);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                *)&country);
    if (!bVar1) {
      Player::setPlayerState((this->super_PlayerStrategy).player,IDLE);
      pPVar8 = Player::getStrategy((this->super_PlayerStrategy).player);
      (*pPVar8->_vptr_PlayerStrategy[5])();
      return 1;
    }
    ppCVar6 = __gnu_cxx::
              __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
              ::operator*(&__end1);
    pvVar5 = Map::Country::getAdjCountries(*ppCVar6);
    __end2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar5);
    neighbour = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar5)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                       *)&neighbour), bVar1) {
      ppCVar6 = __gnu_cxx::
                __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                ::operator*(&__end2);
      this_00 = *ppCVar6;
      iVar2 = Map::Country::getPlayerOwnerID(this_00);
      iVar3 = Player::getPlayerId((this->super_PlayerStrategy).player);
      if (iVar2 != iVar3) {
        __range3 = (vector<Player_*,_std::allocator<Player_*>_> *)0x0;
        this_01 = GameLoop::getInstance();
        this_02 = GameLoop::getAllPlayers(this_01);
        __end3 = std::vector<Player_*,_std::allocator<Player_*>_>::begin(this_02);
        i = (Player *)std::vector<Player_*,_std::allocator<Player_*>_>::end(this_02);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                                           *)&i), bVar1) {
          ppPVar7 = __gnu_cxx::
                    __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                    ::operator*(&__end3);
          local_80 = *ppPVar7;
          iVar2 = Player::getPlayerId(local_80);
          iVar3 = Map::Country::getPlayerOwnerID(this_00);
          if (iVar2 == iVar3) {
            __range3 = (vector<Player_*,_std::allocator<Player_*>_> *)local_80;
          }
          __gnu_cxx::__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
          ::operator++(&__end3);
        }
        if (__range3 == (vector<Player_*,_std::allocator<Player_*>_> *)0x0) {
          Player::setPlayerState((this->super_PlayerStrategy).player,IDLE);
          pPVar8 = Player::getStrategy((this->super_PlayerStrategy).player);
          (*pPVar8->_vptr_PlayerStrategy[5])();
          return -1;
        }
        bVar1 = exchangeCountryOwnership(this,(Player *)__range3,this_00);
        if (!bVar1) {
          Player::setPlayerState((this->super_PlayerStrategy).player,IDLE);
          pPVar8 = Player::getStrategy((this->super_PlayerStrategy).player);
          (*pPVar8->_vptr_PlayerStrategy[5])();
          return -1;
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"[CHEATER] - Country ");
        Map::Country::getCountryName_abi_cxx11_(&local_a0,this_00);
        poVar4 = std::operator<<(poVar4,(string *)&local_a0);
        poVar4 = std::operator<<(poVar4," has been attacked & conquered by Player ");
        iVar2 = Player::getPlayerId((this->super_PlayerStrategy).player);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        std::operator<<(poVar4," -\n");
        std::__cxx11::string::~string((string *)&local_a0);
      }
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

int CheaterBotStrategy::cheaterAttack() {
    std::cout << "We have a cheater! They are conquering all their neighbouring countries" << std::endl;
    for (auto* country : *this->player->getOwnedCountries()) {
        for (auto* neighbour : *country->getAdjCountries()) {
            if (neighbour->getPlayerOwnerID() == this->player->getPlayerId()) {
                continue;
            }
            Player* defendingPlayer = nullptr;
            for (auto* i : *GameLoop::getInstance()->getAllPlayers()) {
                if (i->getPlayerId() == neighbour->getPlayerOwnerID()) {
                    defendingPlayer = i;
                }
            }
            if (defendingPlayer == nullptr) {
                player->setPlayerState(PlayerState::IDLE);
                player->getStrategy()->resetChoices();
                return PlayerAction::FAILED;
            }
            if (exchangeCountryOwnership(defendingPlayer, neighbour)) {
                std::cout << "[CHEATER] - Country " << neighbour->getCountryName() << " has been attacked & conquered by Player " << this->player->getPlayerId() << " -\n";
                continue;
            } else {
                player->setPlayerState(PlayerState::IDLE);
                player->getStrategy()->resetChoices();
                return PlayerAction::FAILED;
            }
        }
    }
    player->setPlayerState(PlayerState::IDLE);
    player->getStrategy()->resetChoices();
    return PlayerAction::SUCCEEDED;
}